

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# so2.hpp
# Opt level: O0

Transformation __thiscall
Sophus::SO2Base<Sophus::SO2<float,_0>_>::matrix(SO2Base<Sophus::SO2<float,_0>_> *this)

{
  DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *pDVar1;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar2;
  SO2Base<Sophus::SO2<float,_0>_> *in_RSI;
  undefined8 extraout_XMM0_Qa;
  undefined4 uVar3;
  undefined4 uVar4;
  Transformation TVar5;
  float local_4c;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> local_48;
  CoeffReturnType local_28;
  Scalar *imag;
  Scalar *real;
  SO2Base<Sophus::SO2<float,_0>_> *this_local;
  Transformation *R;
  
  this_local = this;
  pDVar1 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)unit_complex(in_RSI);
  imag = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::x(pDVar1);
  pDVar1 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)unit_complex(in_RSI);
  local_28 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::y(pDVar1);
  Eigen::Matrix<float,_2,_2,_0,_2,_2>::Matrix((Matrix<float,_2,_2,_0,_2,_2> *)this);
  Eigen::DenseBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator<<
            (&local_48,(DenseBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)this,imag);
  uVar3 = 0x80000000;
  uVar4 = 0x80000000;
  local_4c = -*local_28;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (&local_48,&local_4c);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar2,local_28)
  ;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar2,imag);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::~CommaInitializer(&local_48);
  TVar5.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3] =
       (float)uVar4;
  TVar5.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] =
       (float)uVar3;
  TVar5.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       (float)(int)extraout_XMM0_Qa;
  TVar5.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1] =
       (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Transformation)
         TVar5.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array;
}

Assistant:

matrix() const {
    Scalar const& real = unit_complex().x();
    Scalar const& imag = unit_complex().y();
    Transformation R;
    // clang-format off
        R <<
             real, -imag,
                imag,  real;
    // clang-format on
    return R;
  }